

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

void google::protobuf::compiler::cpp::
     ForEachField<true,google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile(google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences*)::__0>
               (Descriptor *d,anon_class_16_2_3fe543fb *func)

{
  Descriptor *d_00;
  FieldDescriptor *pFVar1;
  int i;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < d->nested_type_count_; iVar2 = iVar2 + 1) {
    d_00 = Descriptor::nested_type(d,iVar2);
    ForEachField<true,google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile(google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences*)::__0>
              (d_00,func);
  }
  for (iVar2 = 0; iVar2 < d->extension_count_; iVar2 = iVar2 + 1) {
    pFVar1 = Descriptor::extension(d,iVar2);
    FileGenerator::GetCrossFileReferencesForFile::anon_class_16_2_3fe543fb::operator()(func,pFVar1);
  }
  for (iVar2 = 0; iVar2 < d->field_count_; iVar2 = iVar2 + 1) {
    pFVar1 = Descriptor::field(d,iVar2);
    FileGenerator::GetCrossFileReferencesForFile::anon_class_16_2_3fe543fb::operator()(func,pFVar1);
  }
  return;
}

Assistant:

void ForEachField(const Descriptor* d, T&& func) {
  if (do_nested_types) {
    for (int i = 0; i < d->nested_type_count(); i++) {
      ForEachField<true>(d->nested_type(i), std::forward<T&&>(func));
    }
  }
  for (int i = 0; i < d->extension_count(); i++) {
    func(d->extension(i));
  }
  for (int i = 0; i < d->field_count(); i++) {
    func(d->field(i));
  }
}